

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_provider.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PixieProvider::CheckType
          (PixieProvider *this,ByteBuffer *message_frame,uchar *expected_type)

{
  int iVar1;
  ostream *poVar2;
  invalid_argument *this_00;
  string local_1c0 [32];
  stringstream error_message;
  ostream local_190 [376];
  
  iVar1 = (**(message_frame->super_InputStream)._vptr_InputStream)(message_frame);
  if ((uchar)iVar1 == *expected_type) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&error_message);
  poVar2 = std::operator<<(local_190,"received a message fo type ");
  poVar2 = std::operator<<(poVar2,(uchar)iVar1);
  poVar2 = std::operator<<(poVar2," when expecting a message of type ");
  std::operator<<(poVar2,*expected_type);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1c0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void PixieProvider::CheckType(ByteBuffer& message_frame, const unsigned char& expected_type)
{
    unsigned char received_type = message_frame.ReadByte();

    if (received_type != expected_type)
    {
        std::stringstream error_message;
        error_message << "received a message fo type " << received_type << " when expecting a message of type " << expected_type;
        throw std::invalid_argument(error_message.str());
    }
}